

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void assignment(Vm *vm)

{
  char *name;
  size_t length;
  Variable VVar1;
  Token TStack_38;
  
  logic_or(vm);
  if ((vm->compiler).token.type != TOKEN_EQUALS) {
    return;
  }
  name = (vm->compiler).previous.start;
  length = (vm->compiler).previous.length;
  emit_no_arg(vm,OP_POP);
  consume(&TStack_38,vm,TOKEN_EQUALS,"Expected \'=\' after variable name");
  expr(vm);
  VVar1 = resolve_var(vm,name,length);
  if ((VVar1._8_8_ >> 0x20 & 1) != 0) {
    emit_no_arg(vm,OP_DUP);
    if (vm->frame_count == VVar1.frame_offset) {
      emit_byte_arg(vm,OP_STORE,(uint8_t)VVar1.index);
      return;
    }
    emit_short_arg(vm,OP_STORE_OFFSET,(uint8_t)VVar1.frame_offset,(uint8_t)VVar1.index);
    return;
  }
  error(&vm->compiler,"Cannot reassign val");
}

Assistant:

static void assignment(Vm *vm) {
    logic_or(vm);
    Token identifier = vm->compiler.previous;

    if (check(vm, TOKEN_EQUALS)) {
        // TODO remove unnecessary LOAD-POP combination
        emit_no_arg(vm, OP_POP);
        consume(vm, TOKEN_EQUALS, "Expected '=' after variable name");
        expr(vm);
        Variable var = resolve_var(vm, identifier.start, identifier.length);

        if (!var.assignable) {
            error(&vm->compiler, "Cannot reassign val");
        }

        emit_no_arg(vm, OP_DUP);

        if (var.frame_offset != vm->frame_count) {
            // TODO bigger numbers
            emit_short_arg(vm, OP_STORE_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
        } else {
            emit_byte_arg(vm, OP_STORE, (uint8_t) var.index);
        }
    }
}